

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headers_sync_chainwork_tests.cpp
# Opt level: O3

void headers_sync_chainwork_tests::headers_sync_state_invoker(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  unit_test_log_t *puVar3;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  headers_sync_state t;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_710;
  char *local_708;
  char *local_700;
  char *local_6f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_6f0;
  char *local_6e8;
  char *local_6e0;
  char *local_6d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_6d0;
  char *local_6c8;
  char *local_6c0;
  char *local_6b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_6b0;
  char *local_6a8;
  char *local_6a0;
  char *local_698;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_690;
  char *local_688;
  char *local_680;
  char *local_678;
  undefined1 local_670 [112];
  ios_base local_600 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  undefined1 local_4d8 [376];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_680 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/headers_sync_chainwork_tests.cpp"
  ;
  local_678 = "";
  memset((ostringstream *)local_4d8,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4d8);
  local_360[0]._M_string_length = 0;
  local_360[0].field_2._M_local_buf[0] = '\0';
  local_670[0] = (ostringstream)0x22;
  local_360[0]._M_dataplus._M_p = (pointer)&local_360[0].field_2;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4d8,local_670,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4d8,"headers_sync_state",0x12)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4d8,"\" fixture ctor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (local_360,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_670);
  if ((undefined1 *)CONCAT71(local_670._1_7_,local_670[0]) != local_670 + 0x10) {
    operator_delete((undefined1 *)CONCAT71(local_670._1_7_,local_670[0]),local_670._16_8_ + 1);
  }
  local_690 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360[0]._M_dataplus._M_p;
  local_688 = local_360[0]._M_dataplus._M_p + local_360[0]._M_string_length;
  file.m_end = (iterator)0x44;
  file.m_begin = (iterator)&local_680;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file,(size_t)&local_690,msg);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360[0]._M_dataplus._M_p != &local_360[0].field_2) {
    operator_delete(local_360[0]._M_dataplus._M_p,
                    CONCAT71(local_360[0].field_2._M_allocated_capacity._1_7_,
                             local_360[0].field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4d8);
  std::ios_base::~ios_base((ios_base *)(local_4d8 + 0x70));
  RegTestingSetup::RegTestingSetup((RegTestingSetup *)local_4d8);
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_6a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/headers_sync_chainwork_tests.cpp"
  ;
  local_698 = "";
  memset((ostringstream *)local_670,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_670);
  paVar1 = &local_4f8.field_2;
  local_4f8._M_string_length = 0;
  local_4f8.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_4f8._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_670,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_670,"headers_sync_state",0x12)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_670,"\" fixture setup",0xf);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_4f8,&local_58);
  paVar2 = &local_58.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  local_6b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4f8._M_dataplus._M_p;
  local_6a8 = local_4f8._M_dataplus._M_p + local_4f8._M_string_length;
  file_00.m_end = (iterator)0x44;
  file_00.m_begin = (iterator)&local_6a0;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file_00,(size_t)&local_6b0,msg_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_4f8._M_dataplus._M_p,
                    CONCAT71(local_4f8.field_2._M_allocated_capacity._1_7_,
                             local_4f8.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_670);
  std::ios_base::~ios_base(local_600);
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_6c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/headers_sync_chainwork_tests.cpp"
  ;
  local_6b8 = "";
  memset((ostringstream *)local_670,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_670);
  local_4f8._M_string_length = 0;
  local_4f8.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_4f8._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_670,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_670,"headers_sync_state",0x12)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_670,"\" test entry",0xc);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_4f8,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  local_6d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4f8._M_dataplus._M_p;
  local_6c8 = local_4f8._M_dataplus._M_p + local_4f8._M_string_length;
  file_01.m_end = (iterator)0x44;
  file_01.m_begin = (iterator)&local_6c0;
  msg_01.m_end = in_R9;
  msg_01.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file_01,(size_t)&local_6d0,msg_01);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_4f8._M_dataplus._M_p,
                    CONCAT71(local_4f8.field_2._M_allocated_capacity._1_7_,
                             local_4f8.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_670);
  std::ios_base::~ios_base(local_600);
  headers_sync_state::test_method((headers_sync_state *)local_4d8);
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_6e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/headers_sync_chainwork_tests.cpp"
  ;
  local_6d8 = "";
  memset((ostringstream *)local_670,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_670);
  local_4f8._M_string_length = 0;
  local_4f8.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_4f8._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_670,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_670,"headers_sync_state",0x12)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_670,"\" fixture teardown",0x12);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_4f8,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  local_6f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4f8._M_dataplus._M_p;
  local_6e8 = local_4f8._M_dataplus._M_p + local_4f8._M_string_length;
  file_02.m_end = (iterator)0x44;
  file_02.m_begin = (iterator)&local_6e0;
  msg_02.m_end = in_R9;
  msg_02.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file_02,(size_t)&local_6f0,msg_02);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_4f8._M_dataplus._M_p,
                    CONCAT71(local_4f8.field_2._M_allocated_capacity._1_7_,
                             local_4f8.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_670);
  std::ios_base::~ios_base(local_600);
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_700 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/headers_sync_chainwork_tests.cpp"
  ;
  local_6f8 = "";
  memset((ostringstream *)local_670,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_670);
  local_4f8._M_string_length = 0;
  local_4f8.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_4f8._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_670,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_670,"headers_sync_state",0x12)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_670,"\" fixture dtor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_4f8,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  local_710 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4f8._M_dataplus._M_p;
  local_708 = local_4f8._M_dataplus._M_p + local_4f8._M_string_length;
  file_03.m_end = (iterator)0x44;
  file_03.m_begin = (iterator)&local_700;
  msg_03.m_end = in_R9;
  msg_03.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file_03,(size_t)&local_710,msg_03);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_4f8._M_dataplus._M_p,
                    CONCAT71(local_4f8.field_2._M_allocated_capacity._1_7_,
                             local_4f8.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_670);
  std::ios_base::~ios_base(local_600);
  ChainTestingSetup::~ChainTestingSetup((ChainTestingSetup *)local_4d8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(headers_sync_state)
{
    std::vector<CBlockHeader> first_chain;
    std::vector<CBlockHeader> second_chain;

    std::unique_ptr<HeadersSyncState> hss;

    const int target_blocks = 15000;
    arith_uint256 chain_work = target_blocks*2;

    // Generate headers for two different chains (using differing merkle roots
    // to ensure the headers are different).
    GenerateHeaders(first_chain, target_blocks-1, Params().GenesisBlock().GetHash(),
            Params().GenesisBlock().nVersion, Params().GenesisBlock().nTime,
            ArithToUint256(0), Params().GenesisBlock().nBits);

    GenerateHeaders(second_chain, target_blocks-2, Params().GenesisBlock().GetHash(),
            Params().GenesisBlock().nVersion, Params().GenesisBlock().nTime,
            ArithToUint256(1), Params().GenesisBlock().nBits);

    const CBlockIndex* chain_start = WITH_LOCK(::cs_main, return m_node.chainman->m_blockman.LookupBlockIndex(Params().GenesisBlock().GetHash()));
    std::vector<CBlockHeader> headers_batch;

    // Feed the first chain to HeadersSyncState, by delivering 1 header
    // initially and then the rest.
    headers_batch.insert(headers_batch.end(), std::next(first_chain.begin()), first_chain.end());

    hss.reset(new HeadersSyncState(0, Params().GetConsensus(), chain_start, chain_work));
    (void)hss->ProcessNextHeaders({first_chain.front()}, true);
    // Pretend the first header is still "full", so we don't abort.
    auto result = hss->ProcessNextHeaders(headers_batch, true);

    // This chain should look valid, and we should have met the proof-of-work
    // requirement.
    BOOST_CHECK(result.success);
    BOOST_CHECK(result.request_more);
    BOOST_CHECK(hss->GetState() == HeadersSyncState::State::REDOWNLOAD);

    // Try to sneakily feed back the second chain.
    result = hss->ProcessNextHeaders(second_chain, true);
    BOOST_CHECK(!result.success); // foiled!
    BOOST_CHECK(hss->GetState() == HeadersSyncState::State::FINAL);

    // Now try again, this time feeding the first chain twice.
    hss.reset(new HeadersSyncState(0, Params().GetConsensus(), chain_start, chain_work));
    (void)hss->ProcessNextHeaders(first_chain, true);
    BOOST_CHECK(hss->GetState() == HeadersSyncState::State::REDOWNLOAD);

    result = hss->ProcessNextHeaders(first_chain, true);
    BOOST_CHECK(result.success);
    BOOST_CHECK(!result.request_more);
    // All headers should be ready for acceptance:
    BOOST_CHECK(result.pow_validated_headers.size() == first_chain.size());
    // Nothing left for the sync logic to do:
    BOOST_CHECK(hss->GetState() == HeadersSyncState::State::FINAL);

    // Finally, verify that just trying to process the second chain would not
    // succeed (too little work)
    hss.reset(new HeadersSyncState(0, Params().GetConsensus(), chain_start, chain_work));
    BOOST_CHECK(hss->GetState() == HeadersSyncState::State::PRESYNC);
     // Pretend just the first message is "full", so we don't abort.
    (void)hss->ProcessNextHeaders({second_chain.front()}, true);
    BOOST_CHECK(hss->GetState() == HeadersSyncState::State::PRESYNC);

    headers_batch.clear();
    headers_batch.insert(headers_batch.end(), std::next(second_chain.begin(), 1), second_chain.end());
    // Tell the sync logic that the headers message was not full, implying no
    // more headers can be requested. For a low-work-chain, this should causes
    // the sync to end with no headers for acceptance.
    result = hss->ProcessNextHeaders(headers_batch, false);
    BOOST_CHECK(hss->GetState() == HeadersSyncState::State::FINAL);
    BOOST_CHECK(result.pow_validated_headers.empty());
    BOOST_CHECK(!result.request_more);
    // Nevertheless, no validation errors should have been detected with the
    // chain:
    BOOST_CHECK(result.success);
}